

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O0

void __thiscall
Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>::~RenderDeviceBase
          (RenderDeviceBase<Diligent::EngineVkImplTraits> *this)

{
  __int_type_conflict2 _Var1;
  size_type sVar2;
  Char *pCVar3;
  size_type sVar4;
  undefined1 local_50 [8];
  string msg_1;
  string msg;
  RenderDeviceBase<Diligent::EngineVkImplTraits> *this_local;
  
  (this->super_ObjectBase<Diligent::IRenderDeviceVk>).
  super_RefCountedObject<Diligent::IRenderDeviceVk>.super_IRenderDeviceVk.super_IRenderDevice.
  super_IObject._vptr_IObject = (_func_int **)&PTR_QueryInterface_0139c7d8;
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    (&this->m_RecycledDynamicBufferIds);
  _Var1 = std::__atomic_base::operator_cast_to_unsigned_int
                    ((__atomic_base *)&this->m_NextDynamicBufferId);
  if (sVar2 != _Var1) {
    FormatString<char[46]>
              ((string *)((long)&msg_1.field_2 + 8),
               (char (*) [46])"Not all dynamic buffer IDs have been recycled");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"~RenderDeviceBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
               ,0xda);
    std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
  }
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    (&this->m_RecycledDynamicBufferIds);
  sVar4 = std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::size(&this->m_DbgRecycledDynamicBufferIds);
  if (sVar2 != sVar4) {
    FormatString<char[146]>
              ((string *)local_50,
               (char (*) [146])
               "Recycled dynamic buffer ID set does not match the actual number of recycled IDs. This may happen if there were duplicate IDs or because of a bug."
              );
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"~RenderDeviceBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
               ,0xdc);
    std::__cxx11::string::~string((string *)local_50);
  }
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~unordered_set(&this->m_DbgRecycledDynamicBufferIds);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            (&this->m_RecycledDynamicBufferIds);
  RefCntAutoPtr<Diligent::IThreadPool>::~RefCntAutoPtr(&this->m_pShaderCompilationThreadPool);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_PSOCacheAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_MemObjAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_PipeResSignAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_SBTAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_TLASAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_BLASAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_FramebufferAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_RenderPassAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_QueryAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_FenceAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_ResMappingAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_SRBAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_PSOAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_SamplerObjAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_ShaderObjAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_BuffViewObjAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_BufObjAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_TexViewObjAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_TexObjAllocator);
  std::
  vector<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
  ::~vector(&this->m_wpDeferredContexts);
  std::
  vector<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
  ::~vector(&this->m_wpImmediateContexts);
  std::vector<bool,_Diligent::STDAllocator<bool,_Diligent::IMemoryAllocator>_>::~vector
            (&this->m_TexFmtInfoInitFlags);
  std::
  vector<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
  ::~vector(&this->m_TextureFormatsInfo);
  ObjectsRegistry<Diligent::SamplerDesc,_Diligent::RefCntAutoPtr<Diligent::ISampler>,_std::hash<Diligent::SamplerDesc>,_std::equal_to<Diligent::SamplerDesc>_>
  ::~ObjectsRegistry(&this->m_SamplersRegistry);
  RefCntAutoPtr<Diligent::IEngineFactory>::~RefCntAutoPtr(&this->m_pEngineFactory);
  ObjectBase<Diligent::IRenderDeviceVk>::~ObjectBase
            (&this->super_ObjectBase<Diligent::IRenderDeviceVk>);
  return;
}

Assistant:

~RenderDeviceBase()
    {
        VERIFY(m_RecycledDynamicBufferIds.size() == m_NextDynamicBufferId, "Not all dynamic buffer IDs have been recycled");
        VERIFY(m_RecycledDynamicBufferIds.size() == m_DbgRecycledDynamicBufferIds.size(),
               "Recycled dynamic buffer ID set does not match the actual number of recycled IDs. This may happen if there were duplicate IDs or because of a bug.");
    }